

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O3

void __thiscall FPathTraverse::AddLineIntercepts(FPathTraverse *this,int bx,int by)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  intercept_t *piVar7;
  intercept_t *piVar8;
  line_t_conflict *plVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  FBlockLinesIterator it;
  FBlockLinesIterator local_50;
  
  local_50.minx = bx;
  local_50.maxx = bx;
  local_50.miny = by;
  local_50.maxy = by;
  FBlockLinesIterator::StartBlock(&local_50,bx,by);
  plVar9 = FBlockLinesIterator::Next(&local_50);
  if (plVar9 != (line_t_conflict *)0x0) {
    do {
      dVar1 = (plVar9->v1->p).X;
      dVar11 = (this->trace).dx;
      dVar12 = (this->trace).dy;
      dVar2 = (this->trace).x;
      dVar3 = (this->trace).y;
      dVar4 = (plVar9->v1->p).Y;
      if ((dVar2 - (plVar9->v2->p).X) * dVar12 + dVar11 * ((plVar9->v2->p).Y - dVar3) <=
          1.52587890625e-05 ==
          1.52587890625e-05 < (dVar4 - dVar3) * dVar11 + dVar12 * (dVar2 - dVar1)) {
        dVar5 = (plVar9->delta).X;
        dVar6 = (plVar9->delta).Y;
        dVar11 = dVar11 * dVar6 - dVar12 * dVar5;
        dVar12 = 0.0;
        if ((dVar11 != 0.0) || (NAN(dVar11))) {
          dVar12 = ((dVar1 - dVar2) * dVar6 + (dVar3 - dVar4) * dVar5) / dVar11;
        }
        if ((dVar12 <= 1.0) && (this->Startfrac <= dVar12)) {
          TArray<intercept_t,_intercept_t>::Grow(&intercepts,1);
          piVar8 = intercepts.Array;
          uVar10 = (ulong)intercepts.Count;
          intercepts.Array[uVar10].frac = dVar12;
          piVar7 = piVar8 + uVar10;
          piVar7->isaline = true;
          piVar7->done = false;
          piVar8[uVar10].d.line = plVar9;
          intercepts.Count = intercepts.Count + 1;
        }
      }
      plVar9 = FBlockLinesIterator::Next(&local_50);
    } while (plVar9 != (line_t_conflict *)0x0);
  }
  return;
}

Assistant:

void FPathTraverse::AddLineIntercepts(int bx, int by)
{
	FBlockLinesIterator it(bx, by, bx, by, true);
	line_t *ld;

	while ((ld = it.Next()))
	{
		int 				s1;
		int 				s2;
		double 				frac;
		divline_t			dl;

		s1 = P_PointOnDivlineSide (ld->v1->fX(), ld->v1->fY(), &trace);
		s2 = P_PointOnDivlineSide (ld->v2->fX(), ld->v2->fY(), &trace);
		
		if (s1 == s2) continue;	// line isn't crossed
		
		// hit the line
		P_MakeDivline (ld, &dl);
		frac = P_InterceptVector (&trace, &dl);

		if (frac < Startfrac || frac > 1.) continue;	// behind source or beyond end point
			
		intercept_t newintercept;

		newintercept.frac = frac;
		newintercept.isaline = true;
		newintercept.done = false;
		newintercept.d.line = ld;
		intercepts.Push (newintercept);
	}
}